

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControl::moveCursor(QWidgetTextControl *this,MoveOperation op,MoveMode mode)

{
  byte bVar1;
  byte bVar2;
  QWidgetTextControlPrivate *pQVar3;
  int in_EDX;
  MoveMode in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControlPrivate *unaff_retaddr;
  bool moved;
  QWidgetTextControlPrivate *d;
  QTextCursor oldSelection;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 *local_10;
  QTextCursor *oldSelection_00;
  
  oldSelection_00 = *(QTextCursor **)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QWidgetTextControl *)0x71db91);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)&local_10,&pQVar3->cursor);
  bVar1 = QTextCursor::movePosition((int)pQVar3 + 0x88,in_ESI,in_EDX);
  bVar2 = bVar1 & 1;
  QWidgetTextControlPrivate::_q_updateCurrentCharFormatAndSelection
            ((QWidgetTextControlPrivate *)
             (CONCAT17(bVar1,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff));
  (**(code **)(*in_RDI + 0x60))();
  QWidgetTextControlPrivate::repaintOldAndNewSelection(unaff_retaddr,oldSelection_00);
  if ((bVar2 & 1) != 0) {
    cursorPositionChanged((QWidgetTextControl *)0x71dc0f);
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  if (*(QTextCursor **)(in_FS_OFFSET + 0x28) == oldSelection_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::moveCursor(QTextCursor::MoveOperation op, QTextCursor::MoveMode mode)
{
    Q_D(QWidgetTextControl);
    const QTextCursor oldSelection = d->cursor;
    const bool moved = d->cursor.movePosition(op, mode);
    d->_q_updateCurrentCharFormatAndSelection();
    ensureCursorVisible();
    d->repaintOldAndNewSelection(oldSelection);
    if (moved)
        emit cursorPositionChanged();
}